

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O2

BUFFER_HANDLE
mqtt_codec_publish(QOS_VALUE qosValue,_Bool duplicateMsg,_Bool serverRetain,uint16_t packetId,
                  char *topicName,uint8_t *msgBuffer,size_t buffLen,STRING_HANDLE trace_log)

{
  int iVar1;
  BUFFER_HANDLE handle;
  size_t sVar2;
  size_t __n;
  uchar *puVar3;
  char *pcVar4;
  byte flags;
  char *pcVar5;
  char *pcVar6;
  STRING_HANDLE local_48;
  
  if (0x1fffffe < buffLen >> 7 || topicName == (char *)0x0) {
    return (BUFFER_HANDLE)0x0;
  }
  flags = duplicateMsg * '\b' | serverRetain;
  if (qosValue != DELIVER_AT_MOST_ONCE) {
    if (qosValue == DELIVER_AT_LEAST_ONCE) {
      flags = flags | 2;
    }
    else {
      flags = flags | 4;
    }
  }
  handle = BUFFER_new();
  if (handle == (BUFFER_HANDLE)0x0) {
    return (BUFFER_HANDLE)0x0;
  }
  if (trace_log == (STRING_HANDLE)0x0) {
    local_48 = (STRING_HANDLE)0x0;
  }
  else {
    pcVar5 = "false";
    if (duplicateMsg) {
      pcVar5 = "true";
    }
    pcVar6 = "DELIVER_EXACTLY_ONCE";
    if (qosValue == DELIVER_AT_LEAST_ONCE) {
      pcVar6 = "DELIVER_AT_LEAST_ONCE";
    }
    pcVar4 = "DELIVER_AT_MOST_ONCE";
    if (qosValue != DELIVER_AT_MOST_ONCE) {
      pcVar4 = pcVar6;
    }
    local_48 = STRING_construct_sprintf
                         (" | IS_DUP: %s | RETAIN: %d | QOS: %s",pcVar5,(ulong)serverRetain,pcVar4);
  }
  sVar2 = BUFFER_length(handle);
  __n = strlen(topicName);
  if (((__n < 0x10000) &&
      (iVar1 = BUFFER_enlarge(handle,__n + (ulong)(qosValue != DELIVER_AT_MOST_ONCE) * 2 + 2),
      iVar1 == 0)) && (puVar3 = BUFFER_u_char(handle), puVar3 != (uchar *)0x0)) {
    *(ushort *)(puVar3 + sVar2) = (ushort)__n << 8 | (ushort)__n >> 8;
    memcpy(puVar3 + sVar2 + 2,topicName,__n);
    if (local_48 == (STRING_HANDLE)0x0) {
      if (qosValue != DELIVER_AT_MOST_ONCE) goto LAB_00114085;
    }
    else {
      STRING_sprintf(local_48," | TOPIC_NAME: %s",topicName);
      if (qosValue != DELIVER_AT_MOST_ONCE) {
        STRING_sprintf(local_48," | PACKET_ID: %u",(ulong)packetId);
LAB_00114085:
        *(uint16_t *)(puVar3 + sVar2 + 2 + __n) = packetId << 8 | packetId >> 8;
      }
    }
    sVar2 = BUFFER_length(handle);
    if (buffLen == 0) {
      if (trace_log != (STRING_HANDLE)0x0) {
LAB_0011410c:
        STRING_copy(trace_log,"PUBLISH");
      }
    }
    else {
      iVar1 = BUFFER_enlarge(handle,buffLen);
      if ((iVar1 != 0) || (puVar3 = BUFFER_u_char(handle), puVar3 == (uchar *)0x0))
      goto LAB_00113ff0;
      memcpy(puVar3 + sVar2,msgBuffer,buffLen);
      if (trace_log != (STRING_HANDLE)0x0) {
        STRING_sprintf(local_48," | PAYLOAD_LEN: %lu",buffLen);
        goto LAB_0011410c;
      }
    }
    iVar1 = constructFixedHeader(handle,PUBLISH_TYPE,flags);
    if (iVar1 == 0) {
      if (trace_log != (STRING_HANDLE)0x0) {
        STRING_concat_with_STRING(trace_log,local_48);
      }
      goto LAB_00113ffa;
    }
  }
LAB_00113ff0:
  BUFFER_delete(handle);
  handle = (BUFFER_HANDLE)0x0;
LAB_00113ffa:
  if (local_48 != (STRING_HANDLE)0x0) {
    STRING_delete(local_48);
    return handle;
  }
  return handle;
}

Assistant:

BUFFER_HANDLE mqtt_codec_publish(QOS_VALUE qosValue, bool duplicateMsg, bool serverRetain, uint16_t packetId, const char* topicName, const uint8_t* msgBuffer, size_t buffLen, STRING_HANDLE trace_log)
{
    BUFFER_HANDLE result;
    /* Codes_SRS_MQTT_CODEC_07_005: [If the parameters topicName is NULL then mqtt_codec_publish shall return NULL.] */
    if (topicName == NULL)
    {
        result = NULL;
    }
    /* Codes_SRS_MQTT_CODEC_07_036: [mqtt_codec_publish shall return NULL if the buffLen variable is greater than the MAX_SEND_SIZE (0xFFFFFF7F).] */
    else if (buffLen > MAX_SEND_SIZE)
    {
        /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
        result = NULL;
    }
    else
    {
        PUBLISH_HEADER_INFO publishInfo ={ 0 };
        publishInfo.topicName = topicName;
        publishInfo.packetId = packetId;
        publishInfo.qualityOfServiceValue = qosValue;

        uint8_t headerFlags = 0;
        if (duplicateMsg) headerFlags |= PUBLISH_DUP_FLAG;
        if (serverRetain) headerFlags |= PUBLISH_QOS_RETAIN;
        if (qosValue != DELIVER_AT_MOST_ONCE)
        {
            if (qosValue == DELIVER_AT_LEAST_ONCE)
            {
                headerFlags |= PUBLISH_QOS_AT_LEAST_ONCE;
            }
            else
            {
                headerFlags |= PUBLISH_QOS_EXACTLY_ONCE;
            }
        }

        /* Codes_SRS_MQTT_CODEC_07_007: [mqtt_codec_publish shall return a BUFFER_HANDLE that represents a MQTT PUBLISH message.] */
        result = BUFFER_new();
        if (result != NULL)
        {
            STRING_HANDLE varible_header_log = NULL;
            if (trace_log != NULL)
            {
                varible_header_log = STRING_construct_sprintf(" | IS_DUP: %s | RETAIN: %d | QOS: %s", duplicateMsg ? TRUE_CONST : FALSE_CONST,
                    serverRetain ? 1 : 0,
                    retrieve_qos_value(publishInfo.qualityOfServiceValue) );
            }

            if (constructPublishVariableHeader(result, &publishInfo, varible_header_log) != 0)
            {
                /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                size_t payloadOffset = BUFFER_length(result);
                if (buffLen > 0)
                {
                    if (BUFFER_enlarge(result, buffLen) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        uint8_t* iterator = BUFFER_u_char(result);
                        if (iterator == NULL)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
                            BUFFER_delete(result);
                            result = NULL;
                        }
                        else
                        {
                            iterator += payloadOffset;
                            // Write Message
                            (void)memcpy(iterator, msgBuffer, buffLen);
                            if (trace_log)
                            {
                                STRING_sprintf(varible_header_log, " | PAYLOAD_LEN: %lu", (unsigned long)buffLen);
                            }
                        }
                    }
                }

                if (result != NULL)
                {
                    if (trace_log != NULL)
                    {
                        (void)STRING_copy(trace_log, "PUBLISH");
                    }
                    if (constructFixedHeader(result, PUBLISH_TYPE, headerFlags) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        if (trace_log != NULL)
                        {
                            (void)STRING_concat_with_STRING(trace_log, varible_header_log);
                        }
                    }
                }
            }
            if (varible_header_log != NULL)
            {
                STRING_delete(varible_header_log);
            }
        }
    }
    return result;
}